

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O1

bool __thiscall
basisu::tree_vector_quant<basisu::vec<16U,_float>_>::refine_split
          (tree_vector_quant<basisu::vec<16U,_float>_> *this,tsvq_node *node,
          vec<16U,_float> *l_child,uint64_t *l_weight,float *l_var,vector<unsigned_int> *l_children,
          vec<16U,_float> *r_child,uint64_t *r_weight,float *r_var,vector<unsigned_int> *r_children)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong uVar13;
  char cVar14;
  uint32_t i_6;
  uint uVar15;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar16;
  int iVar17;
  char *__function;
  long lVar18;
  vector<unsigned_int> *pvVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint *puVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  double d2;
  double d2_1;
  vec<16U,_float> new_r_child;
  vec<16U,_float> new_l_child;
  vec<16U,_float> res;
  vec<16U,_float> res_2;
  float local_16c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float afStack_70 [16];
  
  vector<unsigned_int>::reserve(l_children,(ulong)(node->m_training_vecs).m_size);
  vector<unsigned_int>::reserve(r_children,(ulong)(node->m_training_vecs).m_size);
  local_16c = 1e+10;
  iVar17 = 0;
  do {
    if (l_children->m_size != 0) {
      l_children->m_size = 0;
    }
    if (r_children->m_size != 0) {
      r_children->m_size = 0;
    }
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    *l_weight = 0;
    *r_weight = 0;
    uVar15 = (node->m_training_vecs).m_size;
    if (uVar15 == 0) {
      fVar28 = 0.0;
      fVar25 = 0.0;
    }
    else {
      uVar21 = 0;
      fVar25 = 0.0;
      fVar28 = 0.0;
      do {
        uVar5 = (node->m_training_vecs).m_p[uVar21];
        if ((this->m_training_vecs).m_size <= uVar5) goto LAB_00249d83;
        uVar20 = (uint)uVar21;
        if (uVar15 <= uVar20) goto LAB_00249d4d;
        ppVar16 = (this->m_training_vecs).m_p + uVar5;
        uVar6 = ppVar16->second;
        fVar26 = 0.0;
        lVar18 = 0;
        do {
          fVar27 = l_child->m_v[lVar18] - (ppVar16->first).m_v[lVar18];
          fVar26 = fVar26 + fVar27 * fVar27;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        fVar27 = 0.0;
        lVar18 = 0;
        do {
          fVar24 = r_child->m_v[lVar18] - (ppVar16->first).m_v[lVar18];
          fVar27 = fVar27 + fVar24 * fVar24;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        fVar24 = (float)uVar6;
        if (fVar27 <= fVar26) {
          lVar18 = 0;
          do {
            pfVar4 = (ppVar16->first).m_v + lVar18;
            fVar26 = pfVar4[1];
            fVar27 = pfVar4[2];
            fVar9 = pfVar4[3];
            lVar1 = lVar18 * 4;
            *(float *)((long)&local_b8 + lVar1) = *pfVar4 * fVar24;
            *(float *)((long)&local_b8 + lVar1 + 4) = fVar26 * fVar24;
            *(float *)((long)&uStack_b0 + lVar1) = fVar27 * fVar24;
            *(float *)((long)&uStack_b0 + lVar1 + 4) = fVar9 * fVar24;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          lVar18 = 0;
          do {
            lVar3 = lVar18 * 4;
            fVar26 = *(float *)((long)&local_b8 + lVar3 + 4);
            fVar27 = *(float *)((long)&uStack_b0 + lVar3);
            fVar9 = *(float *)((long)&uStack_b0 + lVar3 + 4);
            lVar1 = lVar18 * 4;
            fVar10 = *(float *)((long)&local_138 + lVar1 + 4);
            fVar11 = *(float *)((long)&uStack_130 + lVar1);
            fVar12 = *(float *)((long)&uStack_130 + lVar1 + 4);
            lVar2 = lVar18 * 4;
            *(float *)((long)&local_138 + lVar2) =
                 *(float *)((long)&local_138 + lVar1) + *(float *)((long)&local_b8 + lVar3);
            *(float *)((long)&local_138 + lVar2 + 4) = fVar10 + fVar26;
            *(float *)((long)&uStack_130 + lVar2) = fVar11 + fVar27;
            *(float *)((long)&uStack_130 + lVar2 + 4) = fVar12 + fVar9;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          *r_weight = *r_weight + uVar6;
          fVar26 = (ppVar16->first).m_v[0];
          fVar26 = fVar26 * fVar26;
          lVar18 = 1;
          do {
            fVar27 = (ppVar16->first).m_v[lVar18];
            fVar26 = fVar26 + fVar27 * fVar27;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x10);
          if ((node->m_training_vecs).m_size <= uVar20) goto LAB_00249d4d;
          puVar23 = (node->m_training_vecs).m_p + uVar21;
          puVar7 = r_children->m_p;
          uVar15 = r_children->m_size;
          if (puVar23 < puVar7 + uVar15 && (puVar7 <= puVar23 && puVar7 != (uint *)0x0))
          goto LAB_00249d64;
          fVar28 = fVar28 + fVar26 * fVar24;
          pvVar19 = r_children;
          if (r_children->m_capacity <= uVar15) goto LAB_00249697;
        }
        else {
          lVar18 = 0;
          do {
            pfVar4 = (ppVar16->first).m_v + lVar18;
            fVar26 = pfVar4[1];
            fVar27 = pfVar4[2];
            fVar9 = pfVar4[3];
            lVar1 = lVar18 * 4;
            *(float *)((long)&local_b8 + lVar1) = *pfVar4 * fVar24;
            *(float *)((long)&local_b8 + lVar1 + 4) = fVar26 * fVar24;
            *(float *)((long)&uStack_b0 + lVar1) = fVar27 * fVar24;
            *(float *)((long)&uStack_b0 + lVar1 + 4) = fVar9 * fVar24;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          lVar18 = 0;
          do {
            lVar1 = lVar18 * 4;
            fVar26 = *(float *)((long)&local_b8 + lVar1 + 4);
            fVar27 = *(float *)((long)&uStack_b0 + lVar1);
            fVar9 = *(float *)((long)&uStack_b0 + lVar1 + 4);
            lVar2 = lVar18 * 4;
            fVar10 = *(float *)((long)&local_f8 + lVar2 + 4);
            fVar11 = *(float *)((long)&uStack_f0 + lVar2);
            fVar12 = *(float *)((long)&uStack_f0 + lVar2 + 4);
            lVar3 = lVar18 * 4;
            *(float *)((long)&local_f8 + lVar3) =
                 *(float *)((long)&local_f8 + lVar2) + *(float *)((long)&local_b8 + lVar1);
            *(float *)((long)&local_f8 + lVar3 + 4) = fVar10 + fVar26;
            *(float *)((long)&uStack_f0 + lVar3) = fVar11 + fVar27;
            *(float *)((long)&uStack_f0 + lVar3 + 4) = fVar12 + fVar9;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          *l_weight = *l_weight + uVar6;
          fVar26 = (ppVar16->first).m_v[0];
          fVar26 = fVar26 * fVar26;
          lVar18 = 1;
          do {
            fVar27 = (ppVar16->first).m_v[lVar18];
            fVar26 = fVar26 + fVar27 * fVar27;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x10);
          if ((node->m_training_vecs).m_size <= uVar20) goto LAB_00249d4d;
          puVar23 = (node->m_training_vecs).m_p + uVar21;
          puVar7 = l_children->m_p;
          uVar15 = l_children->m_size;
          if (puVar23 < puVar7 + uVar15 && (puVar7 <= puVar23 && puVar7 != (uint *)0x0))
          goto LAB_00249d64;
          fVar25 = fVar25 + fVar26 * fVar24;
          pvVar19 = l_children;
          if (l_children->m_capacity <= uVar15) {
LAB_00249697:
            elemental_vector::increase_capacity
                      ((elemental_vector *)pvVar19,uVar15 + 1,true,4,(object_mover)0x0,false);
          }
        }
        pvVar19->m_p[pvVar19->m_size] = *puVar23;
        pvVar19->m_size = pvVar19->m_size + 1;
        uVar21 = (ulong)(uVar20 + 1);
        uVar15 = (node->m_training_vecs).m_size;
      } while (uVar20 + 1 < uVar15);
    }
    if ((*l_weight == 0) || (*r_weight == 0)) {
      if (l_children->m_size != 0) {
        l_children->m_size = 0;
      }
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      *l_weight = 0;
      if (r_children->m_size != 0) {
        r_children->m_size = 0;
      }
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      *r_weight = 0;
      uVar15 = (node->m_training_vecs).m_size;
      if (uVar15 == 0) {
        fVar28 = 0.0;
        fVar25 = 0.0;
      }
      else {
        uVar21 = 0;
        fVar25 = 0.0;
        fVar28 = 0.0;
        do {
          uVar5 = (node->m_training_vecs).m_p[uVar21];
          if ((this->m_training_vecs).m_size <= uVar5) goto LAB_00249d83;
          uVar20 = (uint)uVar21;
          if (uVar15 <= uVar20) goto LAB_00249d4d;
          ppVar8 = (this->m_training_vecs).m_p;
          ppVar16 = ppVar8 + uVar5;
          uVar6 = ppVar16->second;
          if (uVar21 == 0) {
LAB_00249811:
            local_88 = *(undefined8 *)((ppVar16->first).m_v + 0xc);
            uStack_80 = *(undefined8 *)((ppVar16->first).m_v + 0xe);
            local_98 = *(undefined8 *)((ppVar16->first).m_v + 8);
            uStack_90 = *(undefined8 *)((ppVar16->first).m_v + 10);
            local_a8 = *(undefined8 *)((ppVar16->first).m_v + 4);
            uStack_a0 = *(undefined8 *)((ppVar16->first).m_v + 6);
            local_b8 = *(undefined8 *)(ppVar16->first).m_v;
            uStack_b0 = *(undefined8 *)((ppVar16->first).m_v + 2);
            fVar26 = (float)uVar6;
            lVar18 = 0;
            do {
              pfVar4 = (ppVar16->first).m_v + lVar18;
              fVar27 = pfVar4[1];
              fVar24 = pfVar4[2];
              fVar9 = pfVar4[3];
              afStack_70[lVar18] = *pfVar4 * fVar26;
              afStack_70[lVar18 + 1] = fVar27 * fVar26;
              afStack_70[lVar18 + 2] = fVar24 * fVar26;
              afStack_70[lVar18 + 3] = fVar9 * fVar26;
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0x10);
            lVar18 = 0;
            do {
              fVar27 = afStack_70[lVar18 + 1];
              fVar24 = afStack_70[lVar18 + 2];
              fVar9 = afStack_70[lVar18 + 3];
              lVar1 = lVar18 * 4;
              fVar10 = *(float *)((long)&local_138 + lVar1 + 4);
              fVar11 = *(float *)((long)&uStack_130 + lVar1);
              fVar12 = *(float *)((long)&uStack_130 + lVar1 + 4);
              lVar2 = lVar18 * 4;
              *(float *)((long)&local_138 + lVar2) =
                   *(float *)((long)&local_138 + lVar1) + afStack_70[lVar18];
              *(float *)((long)&local_138 + lVar2 + 4) = fVar10 + fVar27;
              *(float *)((long)&uStack_130 + lVar2) = fVar11 + fVar24;
              *(float *)((long)&uStack_130 + lVar2 + 4) = fVar12 + fVar9;
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0x10);
            *r_weight = *r_weight + uVar6;
            fVar27 = (ppVar16->first).m_v[0];
            fVar27 = fVar27 * fVar27;
            lVar18 = 1;
            do {
              fVar24 = (ppVar16->first).m_v[lVar18];
              fVar27 = fVar27 + fVar24 * fVar24;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0x10);
            if ((node->m_training_vecs).m_size <= uVar20) goto LAB_00249d4d;
            puVar23 = (node->m_training_vecs).m_p + uVar21;
            puVar7 = r_children->m_p;
            uVar15 = r_children->m_size;
            if (puVar23 < puVar7 + uVar15 && (puVar7 <= puVar23 && puVar7 != (uint *)0x0)) {
LAB_00249d64:
              __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                            ,0x267,
                            "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                           );
            }
            fVar28 = fVar28 + fVar27 * fVar26;
            pvVar19 = r_children;
            if (r_children->m_capacity <= uVar15) goto LAB_00249949;
          }
          else {
            fVar26 = (ppVar16->first).m_v[0];
            if ((fVar26 == (float)local_b8) && (!NAN(fVar26) && !NAN((float)local_b8))) {
              uVar13 = 0;
              while (uVar22 = uVar13, uVar22 != 0xf) {
                fVar26 = ppVar8[uVar5].first.m_v[uVar22 + 1];
                pfVar4 = (float *)((long)&local_b8 + uVar22 * 4 + 4);
                if ((fVar26 != *pfVar4) || (uVar13 = uVar22 + 1, NAN(fVar26) || NAN(*pfVar4)))
                break;
              }
              if (0xe < uVar22) goto LAB_00249811;
            }
            fVar26 = (float)uVar6;
            lVar18 = 0;
            do {
              pfVar4 = (ppVar16->first).m_v + lVar18;
              fVar27 = pfVar4[1];
              fVar24 = pfVar4[2];
              fVar9 = pfVar4[3];
              afStack_70[lVar18] = *pfVar4 * fVar26;
              afStack_70[lVar18 + 1] = fVar27 * fVar26;
              afStack_70[lVar18 + 2] = fVar24 * fVar26;
              afStack_70[lVar18 + 3] = fVar9 * fVar26;
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0x10);
            lVar18 = 0;
            do {
              fVar27 = afStack_70[lVar18 + 1];
              fVar24 = afStack_70[lVar18 + 2];
              fVar9 = afStack_70[lVar18 + 3];
              lVar1 = lVar18 * 4;
              fVar10 = *(float *)((long)&local_f8 + lVar1 + 4);
              fVar11 = *(float *)((long)&uStack_f0 + lVar1);
              fVar12 = *(float *)((long)&uStack_f0 + lVar1 + 4);
              lVar2 = lVar18 * 4;
              *(float *)((long)&local_f8 + lVar2) =
                   *(float *)((long)&local_f8 + lVar1) + afStack_70[lVar18];
              *(float *)((long)&local_f8 + lVar2 + 4) = fVar10 + fVar27;
              *(float *)((long)&uStack_f0 + lVar2) = fVar11 + fVar24;
              *(float *)((long)&uStack_f0 + lVar2 + 4) = fVar12 + fVar9;
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0x10);
            *l_weight = *l_weight + uVar6;
            fVar27 = (ppVar16->first).m_v[0];
            fVar27 = fVar27 * fVar27;
            lVar18 = 1;
            do {
              fVar24 = (ppVar16->first).m_v[lVar18];
              fVar27 = fVar27 + fVar24 * fVar24;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0x10);
            if ((node->m_training_vecs).m_size <= uVar20) goto LAB_00249d4d;
            puVar23 = (node->m_training_vecs).m_p + uVar21;
            puVar7 = l_children->m_p;
            uVar15 = l_children->m_size;
            if (puVar23 < puVar7 + uVar15 && (puVar7 <= puVar23 && puVar7 != (uint *)0x0))
            goto LAB_00249d64;
            fVar25 = fVar25 + fVar27 * fVar26;
            pvVar19 = l_children;
            if (l_children->m_capacity <= uVar15) {
LAB_00249949:
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar19,uVar15 + 1,true,4,(object_mover)0x0,false);
            }
          }
          pvVar19->m_p[pvVar19->m_size] = *puVar23;
          pvVar19->m_size = pvVar19->m_size + 1;
          uVar21 = (ulong)(uVar20 + 1);
          uVar15 = (node->m_training_vecs).m_size;
        } while (uVar20 + 1 < uVar15);
      }
      cVar14 = '\x01';
      if ((*l_weight != 0) && (*r_weight != 0)) goto LAB_00249ac7;
    }
    else {
LAB_00249ac7:
      fVar26 = (float)local_f8 * (float)local_f8;
      lVar18 = 1;
      do {
        fVar27 = *(float *)((long)&local_f8 + lVar18 * 4);
        fVar26 = fVar26 + fVar27 * fVar27;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      *l_var = fVar25 - fVar26 / (float)*l_weight;
      fVar25 = (float)local_138 * (float)local_138;
      lVar18 = 1;
      do {
        fVar26 = *(float *)((long)&local_138 + lVar18 * 4);
        fVar25 = fVar25 + fVar26 * fVar26;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      *r_var = fVar28 - fVar25 / (float)*r_weight;
      fVar25 = 1.0 / (float)*l_weight;
      lVar18 = 0;
      do {
        lVar1 = lVar18 * 4;
        fVar28 = *(float *)((long)&local_f8 + lVar1 + 4);
        fVar26 = *(float *)((long)&uStack_f0 + lVar1);
        fVar27 = *(float *)((long)&uStack_f0 + lVar1 + 4);
        lVar2 = lVar18 * 4;
        *(float *)((long)&local_f8 + lVar2) = *(float *)((long)&local_f8 + lVar1) * fVar25;
        *(float *)((long)&local_f8 + lVar2 + 4) = fVar28 * fVar25;
        *(float *)((long)&uStack_f0 + lVar2) = fVar26 * fVar25;
        *(float *)((long)&uStack_f0 + lVar2 + 4) = fVar27 * fVar25;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      fVar25 = 1.0 / (float)*r_weight;
      lVar18 = 0;
      do {
        lVar1 = lVar18 * 4;
        fVar28 = *(float *)((long)&local_138 + lVar1 + 4);
        fVar26 = *(float *)((long)&uStack_130 + lVar1);
        fVar27 = *(float *)((long)&uStack_130 + lVar1 + 4);
        lVar2 = lVar18 * 4;
        *(float *)((long)&local_138 + lVar2) = *(float *)((long)&local_138 + lVar1) * fVar25;
        *(float *)((long)&local_138 + lVar2 + 4) = fVar28 * fVar25;
        *(float *)((long)&uStack_130 + lVar2) = fVar26 * fVar25;
        *(float *)((long)&uStack_130 + lVar2 + 4) = fVar27 * fVar25;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      *(undefined8 *)(l_child->m_v + 0xc) = local_c8;
      *(undefined8 *)(l_child->m_v + 0xe) = uStack_c0;
      *(undefined8 *)(l_child->m_v + 8) = local_d8;
      *(undefined8 *)(l_child->m_v + 10) = uStack_d0;
      *(undefined8 *)(l_child->m_v + 4) = local_e8;
      *(undefined8 *)(l_child->m_v + 6) = uStack_e0;
      *(undefined8 *)l_child->m_v = local_f8;
      *(undefined8 *)(l_child->m_v + 2) = uStack_f0;
      *(undefined8 *)(r_child->m_v + 0xc) = local_108;
      *(undefined8 *)(r_child->m_v + 0xe) = uStack_100;
      *(undefined8 *)(r_child->m_v + 8) = local_118;
      *(undefined8 *)(r_child->m_v + 10) = uStack_110;
      *(undefined8 *)(r_child->m_v + 4) = local_128;
      *(undefined8 *)(r_child->m_v + 6) = uStack_120;
      *(undefined8 *)r_child->m_v = local_138;
      *(undefined8 *)(r_child->m_v + 2) = uStack_130;
      fVar25 = *l_var + *r_var;
      cVar14 = '\x02';
      if (1e-05 <= fVar25) {
        fVar28 = (local_16c - fVar25) / fVar25;
        if (0.00125 <= fVar28) {
          local_16c = fVar25;
        }
        cVar14 = (fVar28 < 0.00125) * '\x02';
      }
    }
    if (cVar14 != '\0') goto LAB_00249d35;
    iVar17 = iVar17 + 1;
  } while (iVar17 != 6);
  cVar14 = '\x02';
LAB_00249d35:
  return cVar14 == '\x02';
LAB_00249d83:
  __function = 
  "const T &basisu::vector<std::pair<basisu::vec<16, float>, unsigned long>>::operator[](size_t) const [T = std::pair<basisu::vec<16, float>, unsigned long>]"
  ;
  goto LAB_00249d98;
LAB_00249d4d:
  __function = "const T &basisu::vector<unsigned int>::operator[](size_t) const [T = unsigned int]";
LAB_00249d98:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x177,__function);
}

Assistant:

bool refine_split(const tsvq_node &node,
			TrainingVectorType &l_child, uint64_t &l_weight, float &l_var, basisu::vector<uint32_t> &l_children,
			TrainingVectorType &r_child, uint64_t &r_weight, float &r_var, basisu::vector<uint32_t> &r_children) const
		{
			l_children.reserve(node.m_training_vecs.size());
			r_children.reserve(node.m_training_vecs.size());

			float prev_total_variance = 1e+10f;

			// Refine left/right children locations using k-means iterations
			const uint32_t cMaxIters = 6;
			for (uint32_t iter = 0; iter < cMaxIters; iter++)
			{
				l_children.resize(0); 
				r_children.resize(0); 

				TrainingVectorType new_l_child(cZero), new_r_child(cZero);

				double l_ttsum = 0.0f, r_ttsum = 0.0f;

				l_weight = 0;
				r_weight = 0;

				for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
				{
					const TrainingVectorType &v = m_training_vecs[node.m_training_vecs[i]].first;
					const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;

					double left_dist2 = l_child.squared_distance_d(v), right_dist2 = r_child.squared_distance_d(v);

					if (left_dist2 >= right_dist2)
					{
						new_r_child += (v * static_cast<float>(weight));
						r_weight += weight;

						r_ttsum += weight * v.dot(v);
						r_children.push_back(node.m_training_vecs[i]);
					}
					else
					{
						new_l_child += (v * static_cast<float>(weight));
						l_weight += weight;

						l_ttsum += weight * v.dot(v);
						l_children.push_back(node.m_training_vecs[i]);
					}
				}

				// Node is unsplittable using the above algorithm - try something else to split it up.
				if ((!l_weight) || (!r_weight))
				{
					l_children.resize(0);
					new_l_child.set(0.0f);
					l_ttsum = 0.0f;
					l_weight = 0;

					r_children.resize(0);
					new_r_child.set(0.0f);
					r_ttsum = 0.0f;
					r_weight = 0;

					TrainingVectorType firstVec;
					for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
					{
						const TrainingVectorType& v = m_training_vecs[node.m_training_vecs[i]].first;
						const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;
					
						if ((!i) || (v == firstVec))
						{
							firstVec = v;

							new_r_child += (v * static_cast<float>(weight));
							r_weight += weight;

							r_ttsum += weight * v.dot(v);
							r_children.push_back(node.m_training_vecs[i]);
						}
						else
						{
							new_l_child += (v * static_cast<float>(weight));
							l_weight += weight;

							l_ttsum += weight * v.dot(v);
							l_children.push_back(node.m_training_vecs[i]);
						}
					}

					if ((!l_weight) || (!r_weight))
						return false;
				}

				l_var = static_cast<float>(l_ttsum - (new_l_child.dot(new_l_child) / l_weight));
				r_var = static_cast<float>(r_ttsum - (new_r_child.dot(new_r_child) / r_weight));

				new_l_child *= (1.0f / l_weight);
				new_r_child *= (1.0f / r_weight);

				l_child = new_l_child;
				r_child = new_r_child;

				float total_var = l_var + r_var;
				const float cGiveupVariance = .00001f;
				if (total_var < cGiveupVariance)
					break;

				// Check to see if the variance has settled
				const float cVarianceDeltaThresh = .00125f;
				if (((prev_total_variance - total_var) / total_var) < cVarianceDeltaThresh)
					break;

				prev_total_variance = total_var;
			}

			return true;
		}